

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

void __thiscall gl4cts::CopyImage::IncompleteTexTest::clean(IncompleteTexTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x480))(1,&this->m_dst_tex_name);
  (**(code **)(lVar2 + 0x480))(1,&this->m_src_tex_name);
  this->m_dst_tex_name = 0;
  this->m_src_tex_name = 0;
  if (this->m_dst_buf_name != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_dst_buf_name);
    this->m_dst_buf_name = 0;
  }
  if (this->m_src_buf_name != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_src_buf_name);
    this->m_src_buf_name = 0;
  }
  return;
}

Assistant:

void IncompleteTexTest::clean()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	/* Clean textures and buffers. Errors ignored */
	gl.deleteTextures(1, &m_dst_tex_name);
	gl.deleteTextures(1, &m_src_tex_name);

	m_dst_tex_name = 0;
	m_src_tex_name = 0;

	if (0 != m_dst_buf_name)
	{
		gl.deleteBuffers(1, &m_dst_buf_name);
		m_dst_buf_name = 0;
	}

	if (0 != m_src_buf_name)
	{
		gl.deleteBuffers(1, &m_src_buf_name);
		m_src_buf_name = 0;
	}
}